

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::SetDistinct
          (RowGroupCollection *this,column_t column_id,
          unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
          *distinct_stats)

{
  ColumnStatistics *this_00;
  TableStatistics *lock;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  stats_lock;
  _Head_base<0UL,_duckdb::DistinctStatistics_*,_false> local_30;
  
  lock = &this->stats;
  TableStatistics::GetLock((TableStatistics *)&stack0xffffffffffffffd8);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
             *)&stack0xffffffffffffffd8);
  this_00 = TableStatistics::GetStats(&this->stats,(TableStatisticsLock *)lock,column_id);
  local_30._M_head_impl =
       (distinct_stats->
       super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
       .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl;
  (distinct_stats->
  super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
       (DistinctStatistics *)0x0;
  ColumnStatistics::SetDistinct
            (this_00,(unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
                      *)&local_30);
  ::std::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
               *)&local_30);
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void RowGroupCollection::SetDistinct(column_t column_id, unique_ptr<DistinctStatistics> distinct_stats) {
	D_ASSERT(column_id != COLUMN_IDENTIFIER_ROW_ID);
	auto stats_lock = stats.GetLock();
	stats.GetStats(*stats_lock, column_id).SetDistinct(std::move(distinct_stats));
}